

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void map_init_emacs(EditLine *el)

{
  el_action_t *peVar1;
  el_action_t *peVar2;
  el_action_t *peVar3;
  long lVar4;
  keymacro_value_t *val;
  wchar_t buf [3];
  
  peVar1 = (el->el_map).alt;
  peVar2 = (el->el_map).key;
  peVar3 = (el->el_map).emacs;
  (el->el_map).type = L'\0';
  (el->el_map).current = peVar2;
  keymacro_reset(el);
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    peVar2[lVar4] = peVar3[lVar4];
    peVar1[lVar4] = '\x1c';
  }
  map_init_meta(el);
  map_init_nls(el);
  buf[0] = L'\x18';
  buf[1] = L'\x18';
  buf[2] = L'\0';
  val = keymacro_map_cmd(el,L'#');
  keymacro_add(el,buf,val,L'\0');
  tty_bind_char(el,L'\x01');
  terminal_bind_arrow(el);
  return;
}

Assistant:

libedit_private void
map_init_emacs(EditLine *el)
{
	int i;
	wchar_t buf[3];
	el_action_t *key = el->el_map.key;
	el_action_t *alt = el->el_map.alt;
	const el_action_t *emacs = el->el_map.emacs;

	el->el_map.type = MAP_EMACS;
	el->el_map.current = el->el_map.key;
	keymacro_reset(el);

	for (i = 0; i < N_KEYS; i++) {
		key[i] = emacs[i];
		alt[i] = ED_UNASSIGNED;
	}

	map_init_meta(el);
	map_init_nls(el);

	buf[0] = CONTROL('X');
	buf[1] = CONTROL('X');
	buf[2] = 0;
	keymacro_add(el, buf, keymacro_map_cmd(el, EM_EXCHANGE_MARK), XK_CMD);

	tty_bind_char(el, 1);
	terminal_bind_arrow(el);
}